

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
InvalidateFixedField<Js::JavascriptString*>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false> *this,
          JavascriptString *propertyKey,
          SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor,
          ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  PropertyId propertyId;
  undefined4 *puVar4;
  
  bVar3 = *(byte *)descriptor;
  if ((bVar3 & 2) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xc89,"(descriptor->isInitialized)","descriptor->isInitialized");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    bVar3 = *(byte *)descriptor;
  }
  *(byte *)descriptor = bVar3 & 0xfb;
  if ((bVar3 & 8) != 0) {
    propertyId = DynamicTypeHandler::TMapKey_GetPropertyId(scriptContext,propertyKey);
    ThreadContext::InvalidatePropertyGuards(scriptContext->threadContext,propertyId);
    *(byte *)descriptor = *(byte *)descriptor & 0xf7;
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::InvalidateFixedField(const TPropertyKey propertyKey, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor, ScriptContext* scriptContext)
    {
        Assert(descriptor->isInitialized);

        descriptor->isFixed = false;

        if (descriptor->usedAsFixed)
        {
#if ENABLE_NATIVE_CODEGEN
            PropertyId propertyId = TMapKey_GetPropertyId(scriptContext, propertyKey);
            scriptContext->GetThreadContext()->InvalidatePropertyGuards(propertyId);
#endif
            descriptor->usedAsFixed = false;
        }
    }